

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O3

bool P_MorphMonster(AActor *actor,PClassActor *spawntype,int duration,int style,
                   PClassActor *enter_flash,PClassActor *exit_flash)

{
  DObject **ppDVar1;
  byte *pbVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  AActor *this;
  AActor *pAVar6;
  PClassActor *pPVar7;
  int iVar8;
  DVector3 local_48;
  
  if (actor == (AActor *)0x0) {
    return false;
  }
  if (spawntype == (PClassActor *)0x0) {
    return false;
  }
  if (actor->player != (player_t *)0x0) {
    return false;
  }
  if (((actor->flags3).Value & 0x2200) == 0x2000) {
    pPVar7 = spawntype;
    if ((PClassActor *)AMorphedMonster::RegistrationInfo.MyClass != spawntype) {
      do {
        pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
        if (pPVar7 == (PClassActor *)AMorphedMonster::RegistrationInfo.MyClass) break;
      } while (pPVar7 != (PClassActor *)0x0);
      if (pPVar7 == (PClassActor *)0x0) goto LAB_0060e347;
    }
    local_48.X = (actor->__Pos).X;
    local_48.Y = (actor->__Pos).Y;
    local_48.Z = (actor->__Pos).Z;
    this = AActor::StaticSpawn(spawntype,&local_48,NO_REPLACE,false);
    DObject::StaticPointerSubstitution((DObject *)actor,(DObject *)this);
    if ((((uint)style >> 0xe & 1) != 0) && (((this->flags2).Value & 0x10000) == 0)) {
      this->Translation = actor->Translation;
    }
    this->tid = actor->tid;
    (this->Angles).Yaw.Degrees = (actor->Angles).Yaw.Degrees;
    this[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)actor;
    this->Alpha = actor->Alpha;
    this->RenderStyle = actor->RenderStyle;
    this->Score = actor->Score;
    iVar8 = 0x578;
    if (duration != 0) {
      iVar8 = duration;
    }
    iVar8 = iVar8 + level.time;
    uVar5 = FRandom::GenRand32(&pr_morphmonst);
    *(uint *)&this[1].super_DThinker.super_DObject.Class = (uVar5 & 0xff) + iVar8;
    *(int *)((long)&this[1].super_DThinker.super_DObject.Class + 4) = style;
    if (exit_flash == (PClassActor *)0x0) {
      exit_flash = (PClassActor *)ATeleportFog::RegistrationInfo.MyClass;
    }
    this[1].super_DThinker.super_DObject.ObjNext = (DObject *)exit_flash;
    *(uint *)&this[1].super_DThinker.super_DObject.GCNext = (actor->flags).Value & 0xffffffbf;
    this->special = actor->special;
    this->args[4] = actor->args[4];
    uVar3 = *(undefined8 *)(actor->args + 2);
    *(undefined8 *)this->args = *(undefined8 *)actor->args;
    *(undefined8 *)(this->args + 2) = uVar3;
    AActor::CopyFriendliness(this,actor,true,true);
    (this->flags).Value = (this->flags).Value | (actor->flags).Value & 0x40000;
    (this->flags3).Value = (this->flags3).Value | (actor->flags3).Value & 8;
    if (((actor->renderflags).Value & 0x8000) != 0) {
      ppDVar1 = &this[1].super_DThinker.super_DObject.GCNext;
      *(byte *)ppDVar1 = *(byte *)ppDVar1 | 0x40;
    }
    AActor::AddToHash(this);
    AActor::RemoveFromHash(actor);
    actor->tid = 0;
    actor->special = 0;
    (actor->flags).Value = (actor->flags).Value & 0xeffffff9 | 0x10000000;
    pbVar2 = (byte *)((long)&(actor->renderflags).Value + 1);
    *pbVar2 = *pbVar2 | 0x80;
    if (enter_flash == (PClassActor *)0x0) {
      enter_flash = (PClassActor *)ATeleportFog::RegistrationInfo.MyClass;
    }
    local_48.Z = gameinfo.telefogheight + (actor->__Pos).Z;
    local_48.X = (actor->__Pos).X;
    local_48.Y = (actor->__Pos).Y;
    pAVar6 = AActor::StaticSpawn(enter_flash,&local_48,ALLOW_REPLACE,false);
    bVar4 = true;
    if (pAVar6 != (AActor *)0x0) {
      (pAVar6->target).field_0.p = this;
    }
  }
  else {
LAB_0060e347:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool P_MorphMonster (AActor *actor, PClassActor *spawntype, int duration, int style, PClassActor *enter_flash, PClassActor *exit_flash)
{
	AMorphedMonster *morphed;

	if (actor == NULL || actor->player || spawntype == NULL ||
		actor->flags3 & MF3_DONTMORPH ||
		!(actor->flags3 & MF3_ISMONSTER) ||
		!spawntype->IsDescendantOf (RUNTIME_CLASS(AMorphedMonster)))
	{
		return false;
	}

	morphed = static_cast<AMorphedMonster *>(Spawn (spawntype, actor->Pos(), NO_REPLACE));
	DObject::StaticPointerSubstitution (actor, morphed);
	if ((style & MORPH_TRANSFERTRANSLATION) && !(morphed->flags2 & MF2_DONTTRANSLATE))
	{
		morphed->Translation = actor->Translation;
	}
	morphed->tid = actor->tid;
	morphed->Angles.Yaw = actor->Angles.Yaw;
	morphed->UnmorphedMe = actor;
	morphed->Alpha = actor->Alpha;
	morphed->RenderStyle = actor->RenderStyle;
	morphed->Score = actor->Score;

	morphed->UnmorphTime = level.time + ((duration) ? duration : MORPHTICS) + pr_morphmonst();
	morphed->MorphStyle = style;
	morphed->MorphExitFlash = (exit_flash) ? exit_flash : RUNTIME_CLASS(ATeleportFog);
	morphed->FlagsSave = actor->flags & ~MF_JUSTHIT;
	morphed->special = actor->special;
	memcpy (morphed->args, actor->args, sizeof(actor->args));
	morphed->CopyFriendliness (actor, true);
	morphed->flags |= actor->flags & MF_SHADOW;
	morphed->flags3 |= actor->flags3 & MF3_GHOST;
	if (actor->renderflags & RF_INVISIBLE)
	{
		morphed->FlagsSave |= MF_JUSTHIT;
	}
	morphed->AddToHash ();
	actor->RemoveFromHash ();
	actor->special = 0;
	actor->tid = 0;
	actor->flags &= ~(MF_SOLID|MF_SHOOTABLE);
	actor->flags |= MF_UNMORPHED;
	actor->renderflags |= RF_INVISIBLE;
	AActor *eflash = Spawn(((enter_flash) ? enter_flash : RUNTIME_CLASS(ATeleportFog)), actor->PosPlusZ(TELEFOGHEIGHT), ALLOW_REPLACE);
	if (eflash)
		eflash->target = morphed;
	return true;
}